

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  double dVar5;
  
  pFVar2 = (this->left_->fadexpr_).right_;
  dVar1 = (this->left_->fadexpr_).left_.constant_;
  pFVar3 = (this->right_->fadexpr_).left_;
  pFVar4 = (this->right_->fadexpr_).right_;
  dVar5 = pFVar3->val_ + pFVar4->val_;
  return ((pFVar2->dx_).ptr_to_data[i] * dVar1 * dVar5 -
         dVar1 * pFVar2->val_ * ((pFVar3->dx_).ptr_to_data[i] + (pFVar4->dx_).ptr_to_data[i])) /
         (dVar5 * dVar5);
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}